

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O0

void __thiscall cppjieba::Trie::DeleteNode(Trie *this,TrieNode *node)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> node_00;
  Trie *in_RSI;
  iterator it;
  unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
  *in_stack_ffffffffffffffd0;
  TrieNode *pTVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false> local_20;
  
  if (in_RSI != (Trie *)0x0) {
    if (in_RSI->root_ != (TrieNode *)0x0) {
      node_00._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
           ::begin(in_stack_ffffffffffffffc8);
      while( true ) {
        local_20._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
             ::end(in_stack_ffffffffffffffc8);
        bVar1 = std::__detail::operator!=
                          ((_Node_iterator_base<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false>
                            *)&stack0xffffffffffffffe8,&local_20);
        if (!bVar1) break;
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
        operator->((_Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>
                    *)0x1b1d89);
        DeleteNode(in_RSI,(TrieNode *)node_00._M_cur);
        std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_false,_false>::
        operator++(in_stack_ffffffffffffffd0);
      }
      pTVar2 = in_RSI->root_;
      if (pTVar2 != (TrieNode *)0x0) {
        std::
        unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
        ::~unordered_map((unordered_map<unsigned_int,_cppjieba::TrieNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>_>
                          *)0x1b1dc0);
        operator_delete(pTVar2,0x38);
      }
    }
    if (in_RSI != (Trie *)0x0) {
      operator_delete(in_RSI,0x10);
    }
  }
  return;
}

Assistant:

void DeleteNode(TrieNode* node) {
    if (NULL == node) {
      return;
    }
    if (NULL != node->next) {
      for (TrieNode::NextMap::iterator it = node->next->begin(); it != node->next->end(); ++it) {
        DeleteNode(it->second);
      }
      delete node->next;
    }
    delete node;
  }